

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O1

bool QWindowSystemInterface::handleExtendedKeyEvent
               (QWindow *window,ulong timestamp,Type type,int key,KeyboardModifiers modifiers,
               quint32 nativeScanCode,quint32 nativeVirtualKey,quint32 nativeModifiers,QString *text
               ,bool autorep,ushort count)

{
  QArrayData *pQVar1;
  QString args_8;
  bool bVar2;
  long in_FS_OFFSET;
  bool in_stack_ffffffffffffffb0;
  unsigned_short in_stack_ffffffffffffffb8;
  QArrayData *local_40;
  char16_t *local_38;
  qsizetype local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &((text->d).d)->super_QArrayData;
  local_38 = (text->d).ptr;
  local_30 = (text->d).size;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  args_8.d.ptr._0_1_ = autorep;
  args_8.d.d = (Data *)&local_40;
  args_8.d.ptr._1_7_ = 0;
  args_8.d.size._0_2_ = count;
  args_8.d.size._2_6_ = 0;
  local_40 = pQVar1;
  bVar2 = QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::
          handleEvent<QWindowSystemInterfacePrivate::KeyEvent,QWindow*,unsigned_long,QEvent::Type,int,QFlags<Qt::KeyboardModifier>,unsigned_int,unsigned_int,unsigned_int,QString,bool,unsigned_short>
                    (window,timestamp,type,key,
                     (QFlags<Qt::KeyboardModifier>)
                     modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                     super_QFlagsStorage<Qt::KeyboardModifier>.i,nativeScanCode,nativeVirtualKey,
                     nativeModifiers,args_8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
  if (local_40 != (QArrayData *)0x0) {
    LOCK();
    (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40,2,0x10);
    }
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QWindowSystemInterface::handleExtendedKeyEvent(QWindow *window, ulong timestamp, QEvent::Type type, int key,
                                                    Qt::KeyboardModifiers modifiers,
                                                    quint32 nativeScanCode, quint32 nativeVirtualKey,
                                                    quint32 nativeModifiers,
                                                    const QString& text, bool autorep,
                                                    ushort count)
{
    return handleWindowSystemEvent<QWindowSystemInterfacePrivate::KeyEvent>(window,
        timestamp, type, key, modifiers, nativeScanCode, nativeVirtualKey, nativeModifiers, text, autorep, count);
}